

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

HelicsPublication
anon_unknown.dwarf_7c6ff::addPublication
          (HelicsFederate fed,
          unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
          *pub)

{
  int iVar1;
  PublicationObject *pPVar2;
  unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_> *puVar3;
  ulong uVar4;
  const_iterator __position;
  ulong uVar5;
  
  pPVar2 = (pub->_M_t).
           super___uniq_ptr_impl<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>
           .super__Head_base<0UL,_helics::PublicationObject_*,_false>._M_head_impl;
  pPVar2->valid = -0x684eff5b;
  __position._M_current =
       *(unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_> **)
        ((long)fed + 0x68);
  puVar3 = *(unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
             **)((long)fed + 0x70);
  if ((__position._M_current == puVar3) ||
     (iVar1 = (pPVar2->pubPtr->super_Interface).handle.hid,
     ((puVar3[-1]._M_t.
       super___uniq_ptr_impl<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
       ._M_t.
       super__Tuple_impl<0UL,_helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>
       .super__Head_base<0UL,_helics::PublicationObject_*,_false>._M_head_impl)->pubPtr->
     super_Interface).handle.hid < iVar1)) {
    std::
    vector<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>,std::allocator<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>>>
    ::
    emplace_back<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>>
              ((vector<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>,std::allocator<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>>>
                *)((long)fed + 0x68),pub);
  }
  else {
    uVar5 = (long)puVar3 - (long)__position._M_current >> 3;
    while (uVar4 = uVar5, 0 < (long)uVar4) {
      uVar5 = uVar4 >> 1;
      if (((__position._M_current[uVar5]._M_t.
            super___uniq_ptr_impl<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
            ._M_t.
            super__Tuple_impl<0UL,_helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>
            .super__Head_base<0UL,_helics::PublicationObject_*,_false>._M_head_impl)->pubPtr->
          super_Interface).handle.hid <= iVar1) {
        __position._M_current = __position._M_current + uVar5 + 1;
        uVar5 = ~uVar5 + uVar4;
      }
    }
    std::
    vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
    ::_M_insert_rval((vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
                      *)((long)fed + 0x68),__position,pub);
  }
  return pPVar2;
}

Assistant:

HelicsPublication addPublication(HelicsFederate fed, std::unique_ptr<helics::PublicationObject> pub)
{
    auto* fedObj = reinterpret_cast<helics::FedObject*>(fed);
    pub->valid = PublicationValidationIdentifier;
    HelicsPublication hpub = pub.get();
    if (fedObj->pubs.empty() || pub->pubPtr->getHandle() > fedObj->pubs.back()->pubPtr->getHandle()) {
        fedObj->pubs.push_back(std::move(pub));
    } else {
        auto ind = std::upper_bound(fedObj->pubs.begin(), fedObj->pubs.end(), pub->pubPtr->getHandle(), pubSearch);
        fedObj->pubs.insert(ind, std::move(pub));
    }

    return hpub;
}